

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxquality.hpp
# Opt level: O2

void __thiscall
soplex::SPxSolverBase<double>::qualConstraintViolation
          (SPxSolverBase<double> *this,double *maxviol,double *sumviol)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  Item *pIVar4;
  DataKey *pDVar5;
  pointer pdVar6;
  pointer pdVar7;
  Nonzero<double> *pNVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  double dVar13;
  double dVar14;
  VectorBase<double> solu;
  _Vector_base<double,_std::allocator<double>_> local_40;
  
  *maxviol = 0.0;
  *sumviol = 0.0;
  VectorBase<double>::VectorBase
            ((VectorBase<double> *)&local_40,
             (this->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.set.
             thenum);
  (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x60])(this,&local_40);
  uVar2 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.set.
          thenum;
  pIVar4 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.set.
           theitem;
  pDVar5 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.set.
           thekey;
  pdVar6 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar7 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  uVar9 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar9 = 0;
  }
  uVar10 = 0;
  do {
    if (uVar10 == uVar9) {
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_40);
      return;
    }
    iVar3 = pDVar5[uVar10].idx;
    uVar2 = pIVar4[iVar3].data.super_SVectorBase<double>.memused;
    uVar11 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar11 = 0;
    }
    dVar13 = 0.0;
    for (lVar12 = 0; uVar11 * 0x10 != lVar12; lVar12 = lVar12 + 0x10) {
      pNVar8 = pIVar4[iVar3].data.super_SVectorBase<double>.m_elem;
      dVar13 = dVar13 + *(double *)((long)&pNVar8->val + lVar12) *
                        local_40._M_impl.super__Vector_impl_data._M_start
                        [*(int *)((long)&pNVar8->idx + lVar12)];
    }
    dVar1 = pdVar6[uVar10];
    if (dVar1 <= dVar13) {
      dVar1 = pdVar7[uVar10];
      dVar14 = 0.0;
      if (dVar1 < dVar13) goto LAB_001c0344;
    }
    else {
LAB_001c0344:
      dVar14 = ABS(dVar13 - dVar1);
    }
    if (*maxviol <= dVar14 && dVar14 != *maxviol) {
      *maxviol = dVar14;
    }
    *sumviol = dVar14 + *sumviol;
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

void SPxSolverBase<R>::qualConstraintViolation(R& maxviol, R& sumviol) const
{
   maxviol = 0.0;
   sumviol = 0.0;

   VectorBase<R> solu(this->nCols());

   getPrimalSol(solu);

   for(int row = 0; row < this->nRows(); ++row)
   {
      const SVectorBase<R>& rowvec = this->rowVector(row);

      R val = 0.0;

      for(int col = 0; col < rowvec.size(); ++col)
         val += rowvec.value(col) * solu[rowvec.index(col)];

      R viol = 0.0;

      assert(this->lhs(row) <= this->rhs(row) + 1e-9);

      if(val < this->lhs(row))
         viol = spxAbs(val - this->lhs(row));
      else if(val > this->rhs(row))
         viol = spxAbs(val - this->rhs(row));

      if(viol > maxviol)
         maxviol = viol;

      sumviol += viol;
   }
}